

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunLatePeepholeOptimizations(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  VmValue *pVVar1;
  bool bVar2;
  uint uVar3;
  VmInstructionType VVar4;
  VmFunction *pVVar5;
  VmBlock *pVVar6;
  VmInstruction *pVVar7;
  VmValue **ppVVar8;
  VmInstruction *pVVar9;
  VmConstant *pVVar10;
  undefined1 in_R8B;
  VmValue *pVVar11;
  VmType type;
  VmType type_00;
  VmType type_01;
  VmType type_02;
  VmConstant *loadType_3;
  VmValue *loadOffset_3;
  VmValue *loadAddress_3;
  VmValue *rhs_3;
  VmInstruction *lhs_3;
  VmConstant *loadType_2;
  VmValue *loadOffset_2;
  VmValue *loadAddress_2;
  VmValue *rhs_2;
  VmInstruction *lhs_2;
  VmConstant *loadType_1;
  VmValue *loadOffset_1;
  VmValue *loadAddress_1;
  VmValue *lhs_1;
  VmInstruction *rhs_1;
  VmConstant *loadType;
  VmValue *loadOffset;
  VmValue *loadAddress;
  VmValue *lhs;
  VmInstruction *rhs;
  VmInstruction *inst;
  VmInstruction *next_1;
  VmInstruction *curr_1;
  VmBlock *block;
  VmBlock *next;
  VmBlock *curr;
  VmFunction *function;
  VmValue *value_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar5 = getType<VmFunction>(value);
  if (pVVar5 == (VmFunction *)0x0) {
    pVVar6 = getType<VmBlock>(value);
    if (pVVar6 == (VmBlock *)0x0) {
      pVVar7 = getType<VmInstruction>(value);
      if (pVVar7 != (VmInstruction *)0x0) {
        if (pVVar7->cmd - VM_INST_ADD < 4) {
          ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,1);
          pVVar9 = getType<VmInstruction>(*ppVVar8);
          if (pVVar9 != (VmInstruction *)0x0) {
            ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,0);
            type.structType = (TypeBase *)pVVar9;
            type._0_8_ = ((*ppVVar8)->type).structType;
            bVar2 = anon_unknown.dwarf_aa461::IsOperationNaturalLoad
                              (*(anon_unknown_dwarf_aa461 **)&(*ppVVar8)->type,type,
                               (VmInstruction *)0x1,(bool)in_R8B);
            if ((((bVar2) &&
                 (uVar3 = SmallArray<VmValue_*,_8U>::size(&(pVVar9->super_VmValue).users),
                 uVar3 == 1)) &&
                (uVar3 = SmallArray<VmValue_*,_4U>::size(&pVVar7->arguments), uVar3 == 2)) &&
               (bVar2 = IsReachableLoadValue(pVVar7,pVVar9), bVar2)) {
              ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar9->arguments,0);
              pVVar11 = *ppVVar8;
              ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar9->arguments,1);
              pVVar1 = *ppVVar8;
              pVVar10 = CreateConstantInt(ctx->allocator,(pVVar7->super_VmValue).source,pVVar9->cmd)
              ;
              VVar4 = anon_unknown.dwarf_aa461::GetOperationWithLoad(pVVar7->cmd);
              ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,0);
              anon_unknown.dwarf_aa461::ChangeInstructionTo
                        (module,pVVar7,VVar4,*ppVVar8,pVVar11,pVVar1,&pVVar10->super_VmValue,
                         (VmValue *)0x0,&module->peepholeOptimizations);
              in_R8B = SUB81(pVVar11,0);
            }
          }
        }
        else if (pVVar7->cmd - VM_INST_POW < 0xd) {
          ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,1);
          pVVar9 = getType<VmInstruction>(*ppVVar8);
          if (pVVar9 != (VmInstruction *)0x0) {
            ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,0);
            type_00.structType = (TypeBase *)pVVar9;
            type_00._0_8_ = ((*ppVVar8)->type).structType;
            bVar2 = anon_unknown.dwarf_aa461::IsOperationNaturalLoad
                              (*(anon_unknown_dwarf_aa461 **)&(*ppVVar8)->type,type_00,
                               (VmInstruction *)0x0,(bool)in_R8B);
            if (((bVar2) &&
                (uVar3 = SmallArray<VmValue_*,_8U>::size(&(pVVar9->super_VmValue).users), uVar3 == 1
                )) && ((uVar3 = SmallArray<VmValue_*,_4U>::size(&pVVar7->arguments), uVar3 == 2 &&
                       (bVar2 = IsReachableLoadValue(pVVar7,pVVar9), bVar2)))) {
              ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar9->arguments,0);
              pVVar11 = *ppVVar8;
              ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar9->arguments,1);
              pVVar1 = *ppVVar8;
              pVVar10 = CreateConstantInt(ctx->allocator,(pVVar7->super_VmValue).source,pVVar9->cmd)
              ;
              VVar4 = anon_unknown.dwarf_aa461::GetOperationWithLoad(pVVar7->cmd);
              ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,0);
              anon_unknown.dwarf_aa461::ChangeInstructionTo
                        (module,pVVar7,VVar4,*ppVVar8,pVVar11,pVVar1,&pVVar10->super_VmValue,
                         (VmValue *)0x0,&module->peepholeOptimizations);
              in_R8B = SUB81(pVVar11,0);
            }
          }
        }
        VVar4 = pVVar7->cmd;
        if ((VVar4 != VM_INST_ADD) && (VVar4 != VM_INST_MUL)) {
          if (VVar4 - VM_INST_LESS < 4) {
            ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,0);
            pVVar9 = getType<VmInstruction>(*ppVVar8);
            if (pVVar9 == (VmInstruction *)0x0) {
              return;
            }
            ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,1);
            type_02.structType = (TypeBase *)pVVar9;
            type_02._0_8_ = ((*ppVVar8)->type).structType;
            bVar2 = anon_unknown.dwarf_aa461::IsOperationNaturalLoad
                              (*(anon_unknown_dwarf_aa461 **)&(*ppVVar8)->type,type_02,
                               (VmInstruction *)0x0,(bool)in_R8B);
            if (!bVar2) {
              return;
            }
            uVar3 = SmallArray<VmValue_*,_8U>::size(&(pVVar9->super_VmValue).users);
            if (uVar3 != 1) {
              return;
            }
            uVar3 = SmallArray<VmValue_*,_4U>::size(&pVVar7->arguments);
            if (uVar3 != 2) {
              return;
            }
            bVar2 = IsReachableLoadValue(pVVar7,pVVar9);
            if (!bVar2) {
              return;
            }
            ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar9->arguments,0);
            pVVar11 = *ppVVar8;
            ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar9->arguments,1);
            pVVar1 = *ppVVar8;
            pVVar10 = CreateConstantInt(ctx->allocator,(pVVar7->super_VmValue).source,pVVar9->cmd);
            VVar4 = anon_unknown.dwarf_aa461::GetMirroredComparisonOperationWithLoad(pVVar7->cmd);
            ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,1);
            anon_unknown.dwarf_aa461::ChangeInstructionTo
                      (module,pVVar7,VVar4,*ppVVar8,pVVar11,pVVar1,&pVVar10->super_VmValue,
                       (VmValue *)0x0,&module->peepholeOptimizations);
            return;
          }
          if ((1 < VVar4 - VM_INST_EQUAL) && (2 < VVar4 - VM_INST_BIT_AND)) {
            return;
          }
        }
        ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,0);
        pVVar9 = getType<VmInstruction>(*ppVVar8);
        if (pVVar9 != (VmInstruction *)0x0) {
          ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,1);
          type_01.structType = (TypeBase *)pVVar9;
          type_01._0_8_ = ((*ppVVar8)->type).structType;
          bVar2 = anon_unknown.dwarf_aa461::IsOperationNaturalLoad
                            (*(anon_unknown_dwarf_aa461 **)&(*ppVVar8)->type,type_01,
                             (VmInstruction *)0x0,(bool)in_R8B);
          if ((((bVar2) &&
               (uVar3 = SmallArray<VmValue_*,_8U>::size(&(pVVar9->super_VmValue).users), uVar3 == 1)
               ) && (uVar3 = SmallArray<VmValue_*,_4U>::size(&pVVar7->arguments), uVar3 == 2)) &&
             (bVar2 = IsReachableLoadValue(pVVar7,pVVar9), bVar2)) {
            ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar9->arguments,0);
            pVVar11 = *ppVVar8;
            ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar9->arguments,1);
            pVVar1 = *ppVVar8;
            pVVar10 = CreateConstantInt(ctx->allocator,(pVVar7->super_VmValue).source,pVVar9->cmd);
            VVar4 = anon_unknown.dwarf_aa461::GetOperationWithLoad(pVVar7->cmd);
            ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,1);
            anon_unknown.dwarf_aa461::ChangeInstructionTo
                      (module,pVVar7,VVar4,*ppVVar8,pVVar11,pVVar1,&pVVar10->super_VmValue,
                       (VmValue *)0x0,&module->peepholeOptimizations);
          }
        }
      }
    }
    else {
      next_1 = pVVar6->firstInstruction;
      while (next_1 != (VmInstruction *)0x0) {
        pVVar7 = next_1->nextSibling;
        RunLatePeepholeOptimizations(ctx,module,&next_1->super_VmValue);
        next_1 = pVVar7;
      }
    }
  }
  else {
    next = pVVar5->firstBlock;
    while (next != (VmBlock *)0x0) {
      pVVar6 = next->nextSibling;
      RunLatePeepholeOptimizations(ctx,module,&next->super_VmValue);
      next = pVVar6;
    }
  }
  return;
}

Assistant:

void RunLatePeepholeOptimizations(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		VmBlock *curr = function->firstBlock;

		while(curr)
		{
			VmBlock *next = curr->nextSibling;
			RunLatePeepholeOptimizations(ctx, module, curr);
			curr = next;
		}
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		VmInstruction *curr = block->firstInstruction;

		while(curr)
		{
			VmInstruction *next = curr->nextSibling;
			RunLatePeepholeOptimizations(ctx, module, curr);
			curr = next;
		}
	}
	else if(VmInstruction *inst = getType<VmInstruction>(value))
	{
		switch(inst->cmd)
		{
		case VM_INST_ADD:
		case VM_INST_SUB:
		case VM_INST_MUL:
		case VM_INST_DIV:
			if(VmInstruction *rhs = getType<VmInstruction>(inst->arguments[1]))
			{
				VmValue *lhs = inst->arguments[0];

				if(IsOperationNaturalLoad(lhs->type, rhs, true) && rhs->users.size() == 1 && inst->arguments.size() == 2 && IsReachableLoadValue(inst, rhs))
				{
					VmValue *loadAddress = rhs->arguments[0];
					VmValue *loadOffset = rhs->arguments[1];

					VmConstant *loadType = CreateConstantInt(ctx.allocator, inst->source, int(rhs->cmd));

					ChangeInstructionTo(module, inst, GetOperationWithLoad(inst->cmd), inst->arguments[0], loadAddress, loadOffset, loadType, NULL, &module->peepholeOptimizations);
				}
			}
			break;
		case VM_INST_POW:
		case VM_INST_MOD:
		case VM_INST_LESS:
		case VM_INST_GREATER:
		case VM_INST_LESS_EQUAL:
		case VM_INST_GREATER_EQUAL:
		case VM_INST_EQUAL:
		case VM_INST_NOT_EQUAL:
		case VM_INST_SHL:
		case VM_INST_SHR:
		case VM_INST_BIT_AND:
		case VM_INST_BIT_OR:
		case VM_INST_BIT_XOR:
			if(VmInstruction *rhs = getType<VmInstruction>(inst->arguments[1]))
			{
				VmValue *lhs = inst->arguments[0];

				if(IsOperationNaturalLoad(lhs->type, rhs, false) && rhs->users.size() == 1 && inst->arguments.size() == 2 && IsReachableLoadValue(inst, rhs))
				{
					VmValue *loadAddress = rhs->arguments[0];
					VmValue *loadOffset = rhs->arguments[1];

					VmConstant *loadType = CreateConstantInt(ctx.allocator, inst->source, int(rhs->cmd));

					ChangeInstructionTo(module, inst, GetOperationWithLoad(inst->cmd), inst->arguments[0], loadAddress, loadOffset, loadType, NULL, &module->peepholeOptimizations);
				}
			}
			break;
		default:
			break;
		}

		switch(inst->cmd)
		{
		case VM_INST_ADD:
		case VM_INST_MUL:
		case VM_INST_EQUAL:
		case VM_INST_NOT_EQUAL:
		case VM_INST_BIT_AND:
		case VM_INST_BIT_OR:
		case VM_INST_BIT_XOR:
			if(VmInstruction *lhs = getType<VmInstruction>(inst->arguments[0]))
			{
				VmValue *rhs = inst->arguments[1];

				if(IsOperationNaturalLoad(rhs->type, lhs, false) && lhs->users.size() == 1 && inst->arguments.size() == 2 && IsReachableLoadValue(inst, lhs))
				{
					VmValue *loadAddress = lhs->arguments[0];
					VmValue *loadOffset = lhs->arguments[1];

					VmConstant *loadType = CreateConstantInt(ctx.allocator, inst->source, int(lhs->cmd));

					ChangeInstructionTo(module, inst, GetOperationWithLoad(inst->cmd), inst->arguments[1], loadAddress, loadOffset, loadType, NULL, &module->peepholeOptimizations);
				}
			}
			break;
		case VM_INST_LESS:
		case VM_INST_GREATER:
		case VM_INST_LESS_EQUAL:
		case VM_INST_GREATER_EQUAL:
			if(VmInstruction *lhs = getType<VmInstruction>(inst->arguments[0]))
			{
				VmValue *rhs = inst->arguments[1];

				if(IsOperationNaturalLoad(rhs->type, lhs, false) && lhs->users.size() == 1 && inst->arguments.size() == 2 && IsReachableLoadValue(inst, lhs))
				{
					VmValue *loadAddress = lhs->arguments[0];
					VmValue *loadOffset = lhs->arguments[1];

					VmConstant *loadType = CreateConstantInt(ctx.allocator, inst->source, int(lhs->cmd));

					ChangeInstructionTo(module, inst, GetMirroredComparisonOperationWithLoad(inst->cmd), inst->arguments[1], loadAddress, loadOffset, loadType, NULL, &module->peepholeOptimizations);
				}
			}
			break;
		default:
			break;
		}
	}
}